

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  void *pvVar4;
  float *pfVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  ulong uVar14;
  void *pvVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  int i_1;
  ulong uVar20;
  void *pvVar21;
  int p;
  ulong uVar22;
  int iVar23;
  void *pvVar24;
  ulong uVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  undefined1 extraout_var [12];
  undefined1 auVar29 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 in_XMM4 [16];
  float *outptr;
  Mat local_f0;
  undefined1 local_a8 [16];
  long local_98;
  long local_90;
  ulong local_88;
  void *local_80;
  Option opt_g;
  
  uVar22 = (long)this->weight_data_size / (long)this->num_output;
  uVar1 = bottom_blob->c;
  local_f0.elemsize = bottom_blob->elemsize;
  local_f0.data = bottom_blob->data;
  local_f0.refcount = bottom_blob->refcount;
  local_f0.elempack = bottom_blob->elempack;
  local_f0.allocator = bottom_blob->allocator;
  local_f0.dims = bottom_blob->dims;
  local_f0.w = bottom_blob->w;
  local_f0.h = bottom_blob->h;
  local_f0.d = bottom_blob->d;
  iVar2 = bottom_blob->w;
  uVar18 = bottom_blob->h;
  local_f0.cstep = bottom_blob->cstep;
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + 1;
    UNLOCK();
  }
  local_f0.c = uVar1;
  if (local_f0.elemsize != 1) {
    opt_g.lightmode = opt->lightmode;
    opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_g.num_threads = opt->num_threads;
    opt_g.workspace_allocator = opt->workspace_allocator;
    opt_g.openmp_blocktime = opt->openmp_blocktime;
    opt_g.use_winograd_convolution = opt->use_winograd_convolution;
    opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_g.use_int8_inference = opt->use_int8_inference;
    opt_g.use_vulkan_compute = opt->use_vulkan_compute;
    uVar25._0_1_ = opt->use_bf16_storage;
    uVar25._1_1_ = opt->use_fp16_packed;
    uVar25._2_1_ = opt->use_fp16_storage;
    uVar25._3_1_ = opt->use_fp16_arithmetic;
    uVar25._4_1_ = opt->use_int8_packed;
    uVar25._5_1_ = opt->use_int8_storage;
    uVar25._6_1_ = opt->use_int8_arithmetic;
    uVar25._7_1_ = opt->use_packing_layout;
    opt_g.use_shader_pack8 = opt->use_shader_pack8;
    opt_g.use_subgroup_basic = opt->use_subgroup_basic;
    opt_g.use_subgroup_vote = opt->use_subgroup_vote;
    opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_g.use_image_storage = opt->use_image_storage;
    opt_g.use_tensor_storage = opt->use_tensor_storage;
    opt_g.use_reserved_0 = opt->use_reserved_0;
    opt_g.flush_denormals = opt->flush_denormals;
    opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_g.use_shader_local_memory = opt->use_shader_local_memory;
    opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_g.use_reserved_6 = opt->use_reserved_6;
    opt_g.use_reserved_7 = opt->use_reserved_7;
    opt_g.use_reserved_8 = opt->use_reserved_8;
    opt_g.use_reserved_9 = opt->use_reserved_9;
    opt_g.use_reserved_10 = opt->use_reserved_10;
    opt_g.use_reserved_11 = opt->use_reserved_11;
    opt_g.blob_allocator = opt->workspace_allocator;
    opt_g._32_8_ = uVar25 & 0xffffffffffffff;
    quantize_to_int8(bottom_blob,&local_f0,&this->bottom_blob_int8_scales,&opt_g);
  }
  iVar13 = (int)uVar22;
  iVar23 = -100;
  if (bottom_blob->dims == 2) {
    iVar12 = this->num_output;
    if ((int)uVar18 < 2 || iVar2 != iVar13) goto LAB_002986b3;
    Mat::create(top_blob,iVar12,uVar18,4,opt->blob_allocator);
    local_80 = top_blob->data;
    if ((local_80 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) goto LAB_0029895d;
    local_98 = (long)top_blob->w * top_blob->elemsize;
    uVar25 = 0;
    if (0 < iVar13) {
      uVar25 = uVar22 & 0xffffffff;
    }
    uVar1 = this->num_output;
    if (this->num_output < 1) {
      uVar1 = 0;
    }
    local_88 = (ulong)uVar18;
    local_90 = (long)local_f0.w * local_f0.elemsize;
    uVar22 = 0;
    pvVar24 = local_f0.data;
    while (pvVar6 = local_80, uVar22 != local_88) {
      local_a8._0_8_ = uVar22;
      lVar16 = local_98 * uVar22;
      pvVar21 = (this->weight_data).data;
      pvVar15 = (this->weight_data_int8_scales).data;
      pfVar3 = (float *)(this->bottom_blob_int8_scales).data;
      iVar2 = this->bias_term;
      iVar23 = this->activation_type;
      pvVar4 = (this->bias_data).data;
      pfVar5 = (float *)(this->activation_params).data;
      for (uVar22 = 0; uVar22 != uVar1; uVar22 = uVar22 + 1) {
        iVar12 = 0;
        for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
          iVar12 = iVar12 + (int)*(char *)((long)pvVar21 + uVar14) *
                            (int)*(char *)((long)pvVar24 + uVar14);
        }
        fVar28 = *(float *)((long)pvVar15 + uVar22 * 4);
        fVar27 = 0.0;
        if (fVar28 != 0.0) {
          fVar27 = 1.0 / (fVar28 * *pfVar3);
        }
        fVar27 = (float)iVar12 * fVar27;
        if (iVar2 != 0) {
          fVar27 = fVar27 + *(float *)((long)pvVar4 + uVar22 * 4);
        }
        in_XMM4._0_4_ = fVar27;
        auVar29 = in_XMM4;
        switch(iVar23) {
        case 1:
          if (fVar27 <= 0.0) {
            auVar9._12_4_ = 0;
            auVar9._0_12_ = in_XMM4._4_12_;
            auVar29 = auVar9 << 0x20;
            in_XMM4 = auVar29;
          }
          break;
        case 2:
          auVar29 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar27) & (uint)*pfVar5 |
                                          -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27));
          break;
        case 3:
          if (fVar27 <= *pfVar5) {
            in_XMM4._0_4_ = *pfVar5;
          }
          fVar27 = pfVar5[1];
          auVar29 = in_XMM4;
          if (fVar27 < in_XMM4._0_4_) {
LAB_0029867c:
            auVar29 = ZEXT416((uint)fVar27);
          }
          break;
        case 4:
          if (88.37626 <= fVar27) {
            in_XMM4._0_4_ = 0x42b0c0a5;
          }
          uVar18 = -(uint)(in_XMM4._0_4_ < -88.37626);
          auVar7._4_4_ = ~in_XMM4._4_4_ & (in_XMM4._4_4_ ^ 0x80000000);
          auVar7._0_4_ = ~uVar18 & (uint)-in_XMM4._0_4_;
          auVar7._8_4_ = ~in_XMM4._8_4_ & (in_XMM4._8_4_ ^ 0x80000000);
          auVar7._12_4_ = ~in_XMM4._12_4_ & (in_XMM4._12_4_ ^ 0x80000000);
          in_XMM4 = ZEXT416(uVar18 & 0x42b0c0a5) | auVar7;
          fVar28 = expf(in_XMM4._0_4_);
          auVar29 = ZEXT416((uint)(1.0 / (fVar28 + 1.0)));
          break;
        case 5:
          fVar28 = expf(fVar27);
          fVar28 = logf(fVar28 + 1.0);
          fVar28 = tanhf(fVar28);
          auVar29._0_4_ = fVar28 * fVar27;
          auVar29._4_12_ = extraout_var;
          break;
        case 6:
          fVar28 = *pfVar5;
          fVar31 = -pfVar5[1] / fVar28;
          auVar29 = ZEXT816(0);
          if ((fVar31 <= fVar27) && (auVar29 = in_XMM4, fVar27 <= fVar31 + 1.0 / fVar28)) {
            fVar27 = (fVar28 * fVar27 + pfVar5[1]) * fVar27;
            goto LAB_0029867c;
          }
        }
        *(int *)((long)pvVar6 + uVar22 * 4 + lVar16) = auVar29._0_4_;
        pvVar21 = (void *)((long)pvVar21 + (long)iVar13);
      }
      pvVar24 = (void *)((long)pvVar24 + local_90);
      uVar22 = local_a8._0_8_ + 1;
    }
  }
  else {
    iVar12 = this->num_output;
LAB_002986b3:
    Mat::create(top_blob,iVar12,4,opt->blob_allocator);
    pvVar24 = top_blob->data;
    if ((pvVar24 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) goto LAB_0029895d;
    uVar18 = uVar18 * iVar2;
    pvVar6 = (this->weight_data_int8_scales).data;
    pfVar3 = (float *)(this->bottom_blob_int8_scales).data;
    iVar2 = this->bias_term;
    pvVar21 = (this->bias_data).data;
    iVar23 = this->activation_type;
    pfVar5 = (float *)(this->activation_params).data;
    uVar22 = 0;
    if (0 < (int)uVar18) {
      uVar22 = (ulong)uVar18;
    }
    uVar10 = uVar1;
    if ((int)uVar1 < 1) {
      uVar10 = 0;
    }
    uVar25 = (ulong)(uint)this->num_output;
    if (this->num_output < 1) {
      uVar25 = 0;
    }
    lVar16 = 0;
    for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
      lVar17 = (long)(this->weight_data).data + lVar16;
      iVar13 = 0;
      pvVar15 = local_f0.data;
      for (uVar19 = 0; uVar19 != uVar10; uVar19 = uVar19 + 1) {
        for (uVar20 = 0; uVar22 != uVar20; uVar20 = uVar20 + 1) {
          iVar13 = iVar13 + (int)*(char *)(lVar17 + uVar20) * (int)*(char *)((long)pvVar15 + uVar20)
          ;
        }
        lVar17 = lVar17 + (int)uVar18;
        pvVar15 = (void *)((long)pvVar15 + local_f0.cstep * local_f0.elemsize);
      }
      fVar28 = *(float *)((long)pvVar6 + uVar14 * 4);
      fVar27 = 0.0;
      if (fVar28 != 0.0) {
        fVar27 = 1.0 / (fVar28 * *pfVar3);
      }
      fVar27 = (float)iVar13 * fVar27;
      if (iVar2 != 0) {
        fVar27 = fVar27 + *(float *)((long)pvVar21 + uVar14 * 4);
      }
      in_XMM4._0_4_ = fVar27;
      auVar30 = in_XMM4;
      switch(iVar23) {
      case 1:
        if (fVar27 <= 0.0) {
          auVar11._12_4_ = 0;
          auVar11._0_12_ = in_XMM4._4_12_;
          auVar30 = auVar11 << 0x20;
          in_XMM4 = auVar30;
        }
        break;
      case 2:
        auVar30 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar27) & (uint)*pfVar5 |
                                        -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27));
        break;
      case 3:
        if (fVar27 <= *pfVar5) {
          in_XMM4._0_4_ = *pfVar5;
        }
        fVar27 = pfVar5[1];
        auVar30 = in_XMM4;
        if (fVar27 < in_XMM4._0_4_) {
LAB_00298944:
          auVar30 = ZEXT416((uint)fVar27);
        }
        break;
      case 4:
        if (88.37626 <= fVar27) {
          in_XMM4._0_4_ = 0x42b0c0a5;
        }
        uVar26 = -(uint)(in_XMM4._0_4_ < -88.37626);
        auVar8._4_4_ = ~in_XMM4._4_4_ & (in_XMM4._4_4_ ^ 0x80000000);
        auVar8._0_4_ = ~uVar26 & (uint)-in_XMM4._0_4_;
        auVar8._8_4_ = ~in_XMM4._8_4_ & (in_XMM4._8_4_ ^ 0x80000000);
        auVar8._12_4_ = ~in_XMM4._12_4_ & (in_XMM4._12_4_ ^ 0x80000000);
        in_XMM4 = ZEXT416(uVar26 & 0x42b0c0a5) | auVar8;
        fVar28 = expf(in_XMM4._0_4_);
        auVar30 = ZEXT416((uint)(1.0 / (fVar28 + 1.0)));
        break;
      case 5:
        local_a8 = in_XMM4;
        fVar28 = expf(fVar27);
        fVar28 = logf(fVar28 + 1.0);
        fVar28 = tanhf(fVar28);
        auVar30._0_4_ = fVar28 * (float)local_a8._0_4_;
        auVar30._4_12_ = extraout_var_00;
        break;
      case 6:
        fVar28 = *pfVar5;
        fVar31 = -pfVar5[1] / fVar28;
        auVar30 = ZEXT816(0);
        if ((fVar31 <= fVar27) && (auVar30 = in_XMM4, fVar27 <= fVar31 + 1.0 / fVar28)) {
          fVar27 = (fVar28 * fVar27 + pfVar5[1]) * fVar27;
          goto LAB_00298944;
        }
      }
      *(int *)((long)pvVar24 + uVar14 * 4) = auVar30._0_4_;
      lVar16 = lVar16 + (int)(uVar18 * uVar1);
    }
  }
  iVar23 = 0;
LAB_0029895d:
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + -1;
    UNLOCK();
    if (*local_f0.refcount == 0) {
      if (local_f0.allocator == (Allocator *)0x0) {
        free(local_f0.data);
      }
      else {
        (*(local_f0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar23;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;
        opt_g.use_packing_layout = false;

        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_g);
    }

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const signed char* m = bottom_blob_int8.row<signed char>(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const signed char* kptr = (const signed char*)weight_data + w * p;
                int sum = 0;

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }
                // dequantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        int offset = size * channels * p;
        // channels
        for (int q = 0; q < channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + offset + size * q;
            const signed char* m = bottom_blob_int8.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
    }

    return 0;
}